

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * monty_sub(MontyContext *mc,mp_int *x,mp_int *y)

{
  mp_int *b;
  uint uVar1;
  mp_int *r;
  
  b = mc->m;
  r = mp_make_sized(b->nw);
  mp_sub_into(r,x,y);
  uVar1 = mp_cmp_hs(x,y);
  mp_cond_add_into(r,r,b,uVar1 ^ 1);
  return r;
}

Assistant:

mp_int *monty_sub(MontyContext *mc, mp_int *x, mp_int *y)
{
    return mp_modsub_in_range(x, y, mc->m);
}